

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_XPM_Image.cxx
# Opt level: O1

void __thiscall Fl_XPM_Image::Fl_XPM_Image(Fl_XPM_Image *this,char *name)

{
  char **ppcVar1;
  int iVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  FILE *__stream;
  char **__dest;
  char *pcVar6;
  byte *pbVar7;
  byte *__s;
  uint uVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  byte *pbVar13;
  bool bVar14;
  int chars_per_pixel;
  int ncolors;
  int H;
  int W;
  char buffer [2068];
  int local_884;
  int local_880;
  int local_87c;
  Fl_Pixmap *local_878;
  int local_870;
  int local_86c;
  char **local_868;
  ulong local_860;
  ulong local_858;
  FILE *local_850;
  byte local_848 [2068];
  undefined1 local_34 [4];
  
  Fl_Pixmap::Fl_Pixmap(&this->super_Fl_Pixmap,(char **)0x0);
  (this->super_Fl_Pixmap).super_Fl_Image._vptr_Fl_Image = (_func_int **)&PTR__Fl_Pixmap_0024e710;
  __stream = (FILE *)fl_fopen(name,"rb");
  if (__stream != (FILE *)0x0) {
    local_878 = &this->super_Fl_Pixmap;
    __dest = (char **)operator_new__(0x800);
    local_858 = ~(ulong)local_848;
    uVar12 = 0;
    local_884 = 0x100;
    do {
      pbVar13 = local_848;
      uVar8 = (uint)uVar12;
      do {
        pcVar6 = fgets((char *)pbVar13,0x814,__stream);
        if (pcVar6 == (char *)0x0) {
          fclose(__stream);
          if (uVar8 == 0) {
            uVar8 = 0;
          }
          else {
            iVar11 = 2;
            if (-1 < local_87c) {
              iVar11 = local_87c + 1;
            }
            if (iVar11 + local_870 <= (int)uVar8) {
              (this->super_Fl_Pixmap).super_Fl_Image.data_ = __dest;
              (this->super_Fl_Pixmap).super_Fl_Image.count_ = uVar8;
              (this->super_Fl_Pixmap).alloc_data = 1;
              Fl_Pixmap::measure(&this->super_Fl_Pixmap);
              return;
            }
          }
          __stream = (FILE *)0x0;
          goto LAB_001b3429;
        }
      } while (local_848[0] != 0x22);
      local_868 = __dest;
      if (local_848[1] != 0x22) {
        pbVar7 = local_848 + 1;
        lVar10 = 0;
        bVar3 = local_848[1];
        local_860 = uVar12;
        local_850 = __stream;
        do {
          __s = pbVar7 + 1;
          if (bVar3 == 0x5c) {
            bVar3 = *__s;
            if (bVar3 < 0xd) {
              if (bVar3 != 0) {
                if (bVar3 != 10) goto LAB_001b316b;
LAB_001b31e7:
                fgets((char *)__s,(int)local_34 - (int)__s,__stream);
              }
            }
            else if (bVar3 == 0x78) {
              __s = pbVar7 + 2;
              iVar11 = 0;
              iVar4 = 0;
              do {
                iVar5 = hexdigit((int)(char)*__s);
                iVar2 = iVar4 * 0x10 + iVar5;
                if (0xf < iVar5) {
                  iVar2 = iVar4;
                }
                iVar4 = iVar2;
                __s = __s + (iVar5 < 0x10);
                bVar14 = iVar11 == 0;
                iVar11 = iVar11 + -1;
              } while ((iVar5 < 0x10) && (bVar14));
              lVar10 = lVar10 + 1;
              *pbVar13 = (byte)iVar4;
              __stream = local_850;
              uVar12 = local_860;
            }
            else {
              if (bVar3 == 0xd) goto LAB_001b31e7;
LAB_001b316b:
              __s = pbVar7 + 2;
              if ((bVar3 & 0xf8) == 0x30) {
                iVar11 = 0;
                uVar8 = (uint)(byte)(bVar3 - 0x30);
                do {
                  iVar4 = hexdigit((int)(char)*__s);
                  uVar9 = iVar4 + uVar8 * 8;
                  if (7 < iVar4) {
                    uVar9 = uVar8;
                  }
                  bVar3 = (byte)uVar9;
                  __s = __s + (iVar4 < 8);
                  bVar14 = iVar11 == 0;
                  iVar11 = iVar11 + -1;
                  uVar12 = local_860;
                } while ((iVar4 < 8) && (uVar8 = uVar9, bVar14));
              }
              lVar10 = lVar10 + 1;
              *pbVar13 = bVar3;
            }
          }
          else {
            lVar10 = lVar10 + 1;
            *pbVar13 = bVar3;
          }
          pbVar7 = __s;
          uVar8 = (uint)uVar12;
          pbVar13 = local_848 + lVar10;
          bVar3 = *pbVar7;
        } while ((bVar3 != 0x22) && (lVar10 < 0x800));
      }
      *pbVar13 = 0;
      __dest = local_868;
      if (local_884 <= (int)uVar8) {
        lVar10 = (long)local_884;
        uVar12 = lVar10 * 8 + 0x800;
        if (local_884 < -0x100) {
          uVar12 = 0xffffffffffffffff;
        }
        __dest = (char **)operator_new__(uVar12);
        ppcVar1 = local_868;
        local_884 = local_884 + 0x100;
        memcpy(__dest,local_868,lVar10 << 3);
        if (ppcVar1 != (char **)0x0) {
          operator_delete__(ppcVar1);
        }
      }
      this = (Fl_XPM_Image *)local_878;
      if (uVar8 == 0) {
        uVar12 = 0;
        iVar11 = __isoc99_sscanf(local_848,"%d%d%d%d",&local_86c,&local_870,&local_87c,&local_880);
        iVar4 = 0xd;
        if (3 < iVar11) goto LAB_001b3338;
      }
      else {
LAB_001b3338:
        iVar11 = local_87c;
        if (local_87c < 0) {
          iVar11 = 1;
        }
        if (((int)uVar8 <= iVar11) ||
           ((long)local_880 * (long)local_86c <= (long)(pbVar13 + local_858 + 1))) {
          iVar11 = local_880;
          if (local_87c < 0) {
            iVar11 = local_87c * -4;
          }
          pbVar13 = pbVar13 + (1 - (long)local_848);
          if ((long)iVar11 < (long)pbVar13) {
            pcVar6 = (char *)operator_new__((ulong)(pbVar13 + 1));
            __dest[(int)uVar8] = pcVar6;
            memcpy(pcVar6,local_848,(size_t)pbVar13);
            __dest[(int)uVar8][(long)pbVar13] = '\0';
            iVar4 = 0;
            uVar12 = (ulong)(uVar8 + 1);
            this = (Fl_XPM_Image *)local_878;
            goto LAB_001b33cc;
          }
        }
        iVar4 = 0xd;
        uVar12 = (ulong)uVar8;
      }
LAB_001b33cc:
    } while (iVar4 == 0);
    if (iVar4 == 0xd) {
      uVar8 = (uint)uVar12;
LAB_001b3429:
      if (0 < (int)uVar8) {
        lVar10 = (ulong)uVar8 + 1;
        do {
          if (__dest[lVar10 + -2] != (char *)0x0) {
            operator_delete__(__dest[lVar10 + -2]);
          }
          lVar10 = lVar10 + -1;
        } while (1 < lVar10);
      }
      if (__dest != (char **)0x0) {
        operator_delete__(__dest);
      }
      if (__stream != (FILE *)0x0) {
        fclose(__stream);
      }
    }
  }
  return;
}

Assistant:

Fl_XPM_Image::Fl_XPM_Image(const char *name) : Fl_Pixmap((char *const*)0) {
  FILE *f;

  if ((f = fl_fopen(name, "rb")) == NULL) return;

  // read all the c-strings out of the file:
  char** new_data = new char *[INITIALLINES];
  char** temp_data;
  int malloc_size = INITIALLINES;
  char buffer[MAXSIZE+20];
  int i = 0;
  int W,H,ncolors,chars_per_pixel;
  while (fgets(buffer,MAXSIZE+20,f)) {
    if (buffer[0] != '\"') continue;
    char *myp = buffer;
    char *q = buffer+1;
    while (*q != '\"' && myp < buffer+MAXSIZE) {
      if (*q == '\\') switch (*++q) {
      case '\r':
      case '\n':
	if (!fgets(q,(int) (buffer+MAXSIZE+20-q),f)) { /* no problem if we hit EOF */ } break;
      case 0:
	break;
      case 'x': {
	q++;
	int n = 0;
	for (int x = 0; x < 2; x++) {
	  int xd = hexdigit(*q);
	  if (xd > 15) break;
	  n = (n<<4)+xd;
	  q++;
	}
	*myp++ = n;
      } break;
      default: {
	int c = *q++;
	if (c>='0' && c<='7') {
	  c -= '0';
	  for (int x=0; x<2; x++) {
	    int xd = hexdigit(*q);
	    if (xd>7) break;
	    c = (c<<3)+xd;
	    q++;
	  }
	}
	*myp++ = c;
      } break;
      } else {
	*myp++ = *q++;
      }
    }
    *myp++ = 0;
    if (i >= malloc_size) {
      temp_data = new char *[malloc_size + INITIALLINES];
      memcpy(temp_data, new_data, sizeof(char *) * malloc_size);
      delete[] new_data;
      new_data = temp_data;
      malloc_size += INITIALLINES;
    }
    // first line has 4 ints: width, height, ncolors, chars_per_pixel
    // followed by color segment: 
    //   if ncolors < 0 this is FLTK (non standard) compressed colormap - all colors coded in single line of 4*ncolors bytes
    //   otherwise - ncolor lines of at least chars_per_pixel bytes
    // followed by pic segment: H lines of at least chars_per_pixel*W bytes
    // next line: would have loved to use measure_pixmap, but it doesn't return all the data!
    if ((!i) && (sscanf(buffer,"%d%d%d%d", &W, &H, &ncolors, &chars_per_pixel) < 4)) goto bad_data; // first line
    else if ((i > (ncolors<0?1:ncolors)) && (myp-buffer-1<W*chars_per_pixel)) goto bad_data; // pic segment
    else if (myp-buffer-1<(ncolors<0?-ncolors*4:chars_per_pixel)) goto bad_data; // color segment
    new_data[i] = new char[myp-buffer+1];
    memcpy(new_data[i], buffer,myp-buffer);
    new_data[i][myp-buffer] = 0;
    i++;
  }

  fclose(f);
  f = NULL;
  if ((!i) || (i<1+(ncolors<0?1:ncolors)+H)) goto bad_data;
  data((const char **)new_data, i);
  alloc_data = 1;

  measure();
  return;
  // dealloc and close as needed when bad data was found
bad_data:
  while (i > 0) delete[] new_data[--i];
  delete[] new_data;
  if (f) fclose(f);
}